

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O2

void dumpDebugStrings(DWARFContext *DCtx,Data *Y)

{
  int iVar1;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *pcVar2;
  undefined1 local_58 [8];
  pair<llvm::StringRef,_llvm::StringRef> SymbolPair;
  StringRef RemainingTable;
  
  iVar1 = (*((DCtx->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[0x11])();
  SymbolPair.second.Length = CONCAT44(extraout_var,iVar1);
  pcVar2 = extraout_RDX;
  while (pcVar2 != (char *)0x0) {
    llvm::StringRef::split
              ((pair<llvm::StringRef,_llvm::StringRef> *)local_58,
               (StringRef *)&SymbolPair.second.Length,'\0');
    pcVar2 = SymbolPair.second.Data;
    SymbolPair.second.Length = SymbolPair.first.Length;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&Y->DebugStrings,(value_type *)local_58);
  }
  return;
}

Assistant:

void dumpDebugStrings(DWARFContext &DCtx, DWARFYAML::Data &Y) {
  StringRef RemainingTable = DCtx.getDWARFObj().getStrSection();
  while (RemainingTable.size() > 0) {
    auto SymbolPair = RemainingTable.split('\0');
    RemainingTable = SymbolPair.second;
    Y.DebugStrings.push_back(SymbolPair.first);
  }
}